

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::~FunctionMockerBase
          (FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *this)

{
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00181838;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
            (&this->super_UntypedFunctionMockerBase);
  Mock::UnregisterLocked(&this->super_UntypedFunctionMockerBase);
  (*(this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase[2])(this);
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_>.
  super__Head_base<0UL,_testing::Matcher<cv::Mat>,_false>._M_head_impl.super_MatcherBase<cv::Mat>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00180ff8;
  linked_ptr<const_testing::MatcherInterface<cv::Mat>_>::~linked_ptr
            (&(this->current_spec_).matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_>.
              super__Head_base<0UL,_testing::Matcher<cv::Mat>,_false>._M_head_impl.
              super_MatcherBase<cv::Mat>.impl_);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_>.
  super__Tuple_impl<1UL,_testing::Matcher<cv::Rect_<int>_>_>.
  super__Head_base<1UL,_testing::Matcher<cv::Rect_<int>_>,_false>._M_head_impl.
  super_MatcherBase<cv::Rect_<int>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001818d0;
  linked_ptr<const_testing::MatcherInterface<cv::Rect_<int>_>_>::~linked_ptr
            (&(this->current_spec_).matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_>.
              super__Tuple_impl<1UL,_testing::Matcher<cv::Rect_<int>_>_>.
              super__Head_base<1UL,_testing::Matcher<cv::Rect_<int>_>,_false>._M_head_impl.
              super_MatcherBase<cv::Rect_<int>_>.impl_);
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }